

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::Reader::recoverFromError(Reader *this,TokenType skipUntilToken)

{
  size_type sVar1;
  Token skip;
  Token local_40;
  
  sVar1 = std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::size
                    (&this->errors_);
  do {
    readToken(this,&local_40);
    if (local_40.type_ == skipUntilToken) break;
  } while (local_40.type_ != tokenEndOfStream);
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::resize
            (&this->errors_,(long)(int)sVar1);
  return false;
}

Assistant:

bool Reader::recoverFromError(TokenType skipUntilToken) {
  int errorCount = int(errors_.size());
  Token skip;
  for (;;) {
    if (!readToken(skip))
      errors_.resize(errorCount); // discard errors caused by recovery
    if (skip.type_ == skipUntilToken || skip.type_ == tokenEndOfStream)
      break;
  }
  errors_.resize(errorCount);
  return false;
}